

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::MacroTemplateToken::~MacroTemplateToken(MacroTemplateToken *this)

{
  undefined8 *in_RDI;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__MacroTemplateToken_0042a268;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ::~vector(unaff_retaddr);
  std::shared_ptr<minja::VariableExpr>::~shared_ptr((shared_ptr<minja::VariableExpr> *)0x31f3d8);
  TemplateToken::~TemplateToken((TemplateToken *)0x31f3e2);
  return;
}

Assistant:

MacroTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<VariableExpr> && n, Expression::Parameters && p)
      : TemplateToken(Type::Macro, loc, pre, post), name(std::move(n)), params(std::move(p)) {}